

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool __thiscall
cmCMakePresetsGraph::ReadProjectPresetsInternal(cmCMakePresetsGraph *this,bool allowNoFiles)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  *this_00;
  cmJSONState *pcVar1;
  _Rb_tree_header *p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *presets;
  _Base_ptr *pp_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  _Head_base<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_false> _Var7;
  bool bVar8;
  byte bVar9;
  byte bVar10;
  char cVar11;
  ExpandMacroResult EVar12;
  uint uVar13;
  int iVar14;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  iterator iVar19;
  const_iterator cVar20;
  _Base_ptr p_Var21;
  const_iterator cVar22;
  const_iterator cVar23;
  _Node_iterator_base<cmCMakePresetsGraph::File_*,_false> _Var24;
  cmCMakePresetsGraph *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  _Link_type p_Var26;
  _Alloc_hider _Var27;
  string *workflowStep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  cycleStatus;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  string installDir;
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> inProgressFiles;
  string binaryDir;
  string filename;
  File *file;
  _Rb_tree_node_base *local_210;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  Error *local_1e0;
  size_t local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [24];
  Error local_1a0;
  undefined1 local_178 [16];
  pointer local_168;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  _Alloc_hider local_148;
  _Base_ptr local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined8 local_128;
  _Base_ptr local_118;
  _Base_ptr local_110;
  string local_108;
  vector<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_> local_e8;
  WorkflowPreset *local_c8;
  cmCMakePresetsGraph *local_c0;
  cmCMakePresetsGraph *local_b8;
  string local_b0;
  string local_90;
  _Rb_tree_node_base *local_70;
  _Base_ptr local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *local_60;
  File *local_58;
  string local_50;
  
  local_200._8_8_ = (this->SourceDir)._M_dataplus._M_p;
  local_200._0_8_ = (this->SourceDir)._M_string_length;
  local_1f0._M_allocated_capacity = 0;
  local_1f0._8_8_ = (Error *)0x16;
  local_1e0 = (Error *)0x90d1a0;
  local_1d8 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_200;
  cmCatViews(&local_90,views);
  local_e8.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar8 = cmsys::SystemTools::FileExists(&local_90);
  if (bVar8) {
    bVar8 = ReadJSONFile(this,&local_90,User,Root,&local_e8,&local_58,&this->errors);
  }
  else {
    local_200._8_8_ = (this->SourceDir)._M_dataplus._M_p;
    local_200._0_8_ = (this->SourceDir)._M_string_length;
    local_1f0._M_allocated_capacity = 0;
    local_1f0._8_8_ = (Error *)0x12;
    local_1e0 = (Error *)0x90d18d;
    local_1d8 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_200;
    cmCatViews((string *)local_1b8,views_00);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    bVar8 = cmsys::SystemTools::FileExists(&local_90);
    if (!bVar8) {
      if (local_e8.
          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_e8.
          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002e6933;
      bVar8 = true;
      if (allowNoFiles) goto LAB_002e66c1;
      cmCMakePresetsErrors::FILE_NOT_FOUND(&local_90,&this->parseState);
      goto LAB_002e66b7;
    }
    bVar8 = ReadJSONFile(this,&local_90,Project,Root,&local_e8,&local_58,&this->errors);
  }
  if (bVar8 != false) {
    if (local_e8.
        super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_e8.
        super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002e6933:
      __assert_fail("inProgressFiles.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsGraph.cxx"
                    ,0x433,"bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool)");
    }
    this_00 = &this->ConfigurePresets;
    bVar8 = anon_unknown.dwarf_a97fa0::
            ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>(this_00,this);
    if ((bVar8) &&
       (__x = this,
       bVar8 = anon_unknown.dwarf_a97fa0::
               ComputePresetInheritance<cmCMakePresetsGraph::ConfigurePreset>(this_00,this), bVar8))
    {
      local_1f0._8_8_ = local_200 + 8;
      local_200._8_8_ = local_200._8_8_ & 0xffffffff00000000;
      local_1f0._M_allocated_capacity = 0;
      local_1d8 = 0;
      p_Var16 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(this->BuildPresets)._M_t._M_impl.super__Rb_tree_header;
      local_1e0 = (Error *)local_1f0._8_8_;
      if ((_Rb_tree_header *)p_Var16 != p_Var2) {
        do {
          __x = (cmCMakePresetsGraph *)(p_Var16 + 1);
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                  *)local_200,(key_type *)__x);
          *pmVar15 = Unvisited;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != p_Var2);
        p_Var16 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      local_b8 = (cmCMakePresetsGraph *)&this->BuildPresets;
      local_110 = &p_Var2->_M_header;
      if ((_Rb_tree_header *)p_Var16 != p_Var2) {
        do {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 *)local_1b8,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 *)local_200);
          __x = local_b8;
          bVar8 = anon_unknown.dwarf_a97fa0::VisitPreset<cmCMakePresetsGraph::BuildPreset>
                            ((BuildPreset *)(p_Var16 + 2),
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                              *)local_b8,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                              *)local_1b8,this);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      *)local_1b8._16_8_,(_Link_type)__x);
          if (!bVar8) goto LAB_002e66ad;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != local_110);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  *)local_1f0._M_allocated_capacity,(_Link_type)__x);
      local_200._8_8_ = local_200._8_8_ & 0xffffffff00000000;
      local_1f0._M_allocated_capacity = 0;
      local_1f0._8_8_ = local_200 + 8;
      local_1d8 = 0;
      p_Var16 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_118 = &(this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1e0 = (Error *)local_1f0._8_8_;
      if (p_Var16 != local_118) {
        do {
          __x = (cmCMakePresetsGraph *)(p_Var16 + 1);
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                  *)local_200,(key_type *)__x);
          *pmVar15 = Unvisited;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != local_118);
        p_Var16 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      local_c0 = (cmCMakePresetsGraph *)&this->TestPresets;
      if (p_Var16 != local_118) {
        do {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 *)local_1b8,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                 *)local_200);
          __x = local_c0;
          bVar8 = anon_unknown.dwarf_a97fa0::VisitPreset<cmCMakePresetsGraph::TestPreset>
                            ((TestPreset *)(p_Var16 + 2),
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                              *)local_c0,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                              *)local_1b8,this);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      *)local_1b8._16_8_,(_Link_type)__x);
          if (!bVar8) goto LAB_002e66ad;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while (p_Var16 != local_118);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  *)local_1f0._M_allocated_capacity,(_Link_type)__x);
      presets = &this->PackagePresets;
      bVar8 = anon_unknown.dwarf_a97fa0::
              ComputePresetInheritance<cmCMakePresetsGraph::PackagePreset>(presets,this);
      if ((bVar8) &&
         (bVar8 = anon_unknown.dwarf_a97fa0::
                  ComputePresetInheritance<cmCMakePresetsGraph::WorkflowPreset>
                            (&this->WorkflowPresets,this), bVar8)) {
        p_Var18 = (this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_140 = &(this->ConfigurePresets)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_60 = presets;
        if (p_Var18 != local_140) {
          pcVar1 = &this->parseState;
          do {
            pp_Var3 = &p_Var18[0x13]._M_right;
            std::optional<cmCMakePresetsGraph::ConfigurePreset>::
            emplace<cmCMakePresetsGraph::ConfigurePreset_const&>
                      ((optional<cmCMakePresetsGraph::ConfigurePreset> *)pp_Var3,
                       (ConfigurePreset *)(p_Var18 + 2));
            local_178._8_4_ = _S_red;
            local_168 = (pointer)0x0;
            local_160 = (pointer)(local_178 + 8);
            local_150 = (pointer)0x0;
            local_158 = local_160;
            for (p_Var17 = p_Var18[0x19]._M_right;
                p_Var17 != (_Rb_tree_node_base *)&p_Var18[0x19]._M_parent;
                p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_178,(key_type *)(p_Var17 + 1));
              *pmVar15 = Unvisited;
            }
            local_138._M_allocated_capacity = 0;
            local_138._8_8_ = 0;
            local_128 = 0;
            local_200._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_200._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00bbad40;
            ((MacroExpander *)(local_200._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_200._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_138._M_local_buf,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_200);
            if ((MacroExpander *)local_200._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_200._0_8_)[2])();
            }
            local_200._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_200._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00bbb1f8;
            ((MacroExpander *)(local_200._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_200._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var18 + 2);
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_138._M_local_buf,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_200);
            if ((MacroExpander *)local_200._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_200._0_8_)[2])();
            }
            local_200._0_8_ = operator_new(0x20);
            *(undefined ***)local_200._0_8_ = &PTR_operator___00bbb078;
            *(undefined1 **)(local_200._0_8_ + 8) = local_178;
            *(_Base_ptr **)(local_200._0_8_ + 0x10) = pp_Var3;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(local_200._0_8_ + 0x18) = &local_138;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_138._M_local_buf,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_200);
            if ((_Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                 )local_200._0_8_ != (MacroExpander *)0x0) {
              (**(code **)(*(size_type *)local_200._0_8_ + 0x10))();
            }
            p_Var17 = p_Var18[0x19]._M_right;
            _Var7._M_head_impl = (MacroExpander *)local_200._0_8_;
            while (local_200._0_8_ = _Var7._M_head_impl,
                  p_Var17 != (_Rb_tree_node_base *)&p_Var18[0x19]._M_parent) {
              if ((char)p_Var17[3]._M_color == _S_black) {
                pmVar15 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                        *)local_178,(key_type *)(p_Var17 + 1));
                if (*pmVar15 != Verified) {
                  if (*pmVar15 == InProgress) {
LAB_002e670b:
                    p_Var26 = (_Link_type)pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED
                              ((string *)&p_Var18[2]._M_parent,pcVar1);
                    std::
                    vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                    ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                               *)&local_138);
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                *)local_168,p_Var26);
                    goto LAB_002e6733;
                  }
                  _Var5 = p_Var18[4]._M_parent[1]._M_color;
                  *pmVar15 = InProgress;
                  paVar25 = &local_138;
                  EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)(p_Var17 + 2),(MacroExpanderVector *)paVar25,_Var5);
                  if (EVar12 == Ok) {
                    *pmVar15 = Verified;
                  }
                  else {
                    if (EVar12 == Ignore) {
                      if (*(char *)&p_Var18[0x25]._M_left == '\x01') {
                        *(undefined1 *)&p_Var18[0x25]._M_left = 0;
                        ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                      }
                      std::
                      vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                      ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                                 *)&local_138);
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                  *)local_168,(_Link_type)paVar25);
                      goto LAB_002e5296;
                    }
                    if (EVar12 == Error) goto LAB_002e670b;
                  }
                }
              }
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              _Var7._M_head_impl = (MacroExpander *)local_200._0_8_;
            }
            p_Var16 = p_Var18[6]._M_left;
            if (p_Var16 == (_Base_ptr)0x0) {
LAB_002e4d05:
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,p_Var18[0xd]._M_parent,
                         (long)&(p_Var18[0xd]._M_left)->_M_color + (long)p_Var18[0xd]._M_parent);
              paVar25 = &local_138;
              EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                 (&local_b0,(MacroExpanderVector *)paVar25,
                                  p_Var18[4]._M_parent[1]._M_color);
              if (EVar12 == Ignore) {
                p_Var17 = (_Rb_tree_node_base *)0x1;
                if (*(char *)&p_Var18[0x25]._M_left == '\x01') {
                  *(undefined1 *)&p_Var18[0x25]._M_left = 0;
                  ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                }
              }
              else if (EVar12 == Error) {
                p_Var17 = (_Rb_tree_node_base *)0x0;
              }
              else {
                if (local_b0._M_string_length != 0) {
                  bVar8 = cmsys::SystemTools::FileIsFullPath(&local_b0);
                  paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_200;
                  if (!bVar8) {
                    local_200._8_8_ = (this->SourceDir)._M_dataplus._M_p;
                    local_200._0_8_ = (this->SourceDir)._M_string_length;
                    local_1f0._M_allocated_capacity = 0;
                    local_1b8._0_8_ = (pointer)0x0;
                    local_1b8._8_8_ = (pointer)0x1;
                    local_1e0 = &local_1a0;
                    local_1a0.location.line._0_1_ = '/';
                    local_1f0._8_8_ = (Error *)0x1;
                    local_1d8 = 0;
                    local_1d0 = local_b0._M_string_length;
                    local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_b0._M_dataplus._M_p;
                    local_1c0 = 0;
                    views_01._M_len = 3;
                    views_01._M_array = (iterator)paVar25;
                    local_1b8._16_8_ = local_1e0;
                    cmCatViews(&local_108,views_01);
                    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_108);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) {
                      operator_delete(local_108._M_dataplus._M_p,
                                      local_108.field_2._M_allocated_capacity + 1);
                    }
                  }
                  cmsys::SystemTools::CollapseFullPath((string *)paVar25,&local_b0);
                  p_Var17 = p_Var18 + 0x1f;
                  std::__cxx11::string::operator=((string *)p_Var17,(string *)paVar25->_M_local_buf)
                  ;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._0_8_ != &local_1f0) {
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_1f0._M_allocated_capacity + 1);
                    operator_delete((void *)local_200._0_8_,(ulong)paVar25);
                  }
                  cmsys::SystemTools::ConvertToUnixSlashes((string *)p_Var17);
                }
                if (p_Var18[0xe]._M_left != (_Base_ptr)0x0) {
                  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_108,p_Var18[0xe]._M_parent,
                             (long)&(p_Var18[0xe]._M_left)->_M_color + (long)p_Var18[0xe]._M_parent)
                  ;
                  paVar25 = &local_138;
                  EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                     (&local_108,(MacroExpanderVector *)paVar25,
                                      p_Var18[4]._M_parent[1]._M_color);
                  if (EVar12 == Ignore) {
                    p_Var17 = (_Rb_tree_node_base *)0x1;
                    if (*(char *)&p_Var18[0x25]._M_left == '\x01') {
                      *(undefined1 *)&p_Var18[0x25]._M_left = 0;
                      ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                    }
                    bVar8 = false;
                  }
                  else if (EVar12 == Error) {
                    bVar8 = false;
                    p_Var17 = (_Rb_tree_node_base *)0x0;
                  }
                  else {
                    bVar8 = cmsys::SystemTools::FileIsFullPath(&local_108);
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_200;
                    if (!bVar8) {
                      local_200._8_8_ = (this->SourceDir)._M_dataplus._M_p;
                      local_200._0_8_ = (this->SourceDir)._M_string_length;
                      local_1f0._M_allocated_capacity = 0;
                      local_1b8._0_8_ = (pointer)0x0;
                      local_1b8._8_8_ = (pointer)0x1;
                      local_1e0 = &local_1a0;
                      local_1a0.location.line._0_1_ = '/';
                      local_1f0._8_8_ = (Error *)0x1;
                      local_1d8 = 0;
                      local_1d0 = local_108._M_string_length;
                      local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_108._M_dataplus._M_p;
                      local_1c0 = 0;
                      views_02._M_len = 3;
                      views_02._M_array = (iterator)paVar25;
                      local_1b8._16_8_ = local_1e0;
                      cmCatViews(&local_50,views_02);
                      std::__cxx11::string::operator=((string *)&local_108,(string *)&local_50);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                      }
                    }
                    cmsys::SystemTools::CollapseFullPath((string *)paVar25,&local_108);
                    p_Var17 = p_Var18 + 0x20;
                    std::__cxx11::string::operator=
                              ((string *)p_Var17,(string *)paVar25->_M_local_buf);
                    if ((MacroExpander *)local_200._0_8_ != (MacroExpander *)&local_1f0) {
                      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(local_1f0._M_allocated_capacity + 1);
                      operator_delete((void *)local_200._0_8_,(ulong)paVar25);
                    }
                    bVar8 = true;
                    cmsys::SystemTools::ConvertToUnixSlashes((string *)p_Var17);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_108.field_2._M_allocated_capacity + 1);
                    operator_delete(local_108._M_dataplus._M_p,(ulong)paVar25);
                  }
                  if (!bVar8) goto LAB_002e524d;
                }
                bVar10 = (byte)p_Var17;
                if (p_Var18[0xc]._M_left != (_Base_ptr)0x0) {
                  local_200._0_8_ = &local_1f0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_200,p_Var18[0xc]._M_parent,
                             (long)&(p_Var18[0xc]._M_left)->_M_color + (long)p_Var18[0xc]._M_parent)
                  ;
                  paVar25 = &local_138;
                  EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)local_200,(MacroExpanderVector *)paVar25,
                                      p_Var18[4]._M_parent[1]._M_color);
                  if (EVar12 == Ignore) {
                    p_Var17 = (_Rb_tree_node_base *)0x1;
                    if (*(char *)&p_Var18[0x25]._M_left == '\x01') {
                      *(undefined1 *)&p_Var18[0x25]._M_left = 0;
                      ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                    }
                    bVar8 = false;
                  }
                  else if (EVar12 == Error) {
                    bVar8 = false;
                    p_Var17 = (_Rb_tree_node_base *)0x0;
                  }
                  else {
                    bVar8 = true;
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_200;
                    std::__cxx11::string::_M_assign((string *)(p_Var18 + 0x1e));
                  }
                  bVar10 = (byte)p_Var17;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._0_8_ != &local_1f0) {
                    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_1f0._M_allocated_capacity + 1);
                    operator_delete((void *)local_200._0_8_,(ulong)paVar25);
                  }
                  if (!bVar8) goto LAB_002e524d;
                }
                p_Var16 = p_Var18[0x21]._M_right;
                bVar9 = 1;
                if (p_Var16 != (_Base_ptr)&p_Var18[0x21]._M_parent) {
                  do {
                    if ((char)p_Var16[4]._M_color == _S_black) {
                      paVar25 = &local_138;
                      EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)(p_Var16 + 3),(MacroExpanderVector *)paVar25,
                                          p_Var18[4]._M_parent[1]._M_color);
                      if (EVar12 == Ignore) {
                        bVar10 = 1;
                        if (*(char *)&p_Var18[0x25]._M_left == '\x01') {
                          *(undefined1 *)&p_Var18[0x25]._M_left = 0;
                          ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                        }
                        bVar9 = 0;
                        goto LAB_002e524a;
                      }
                      if (EVar12 == Error) {
                        bVar9 = 0;
                        bVar10 = 0;
                        goto LAB_002e524a;
                      }
                    }
                    p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
                  } while (p_Var16 != (_Base_ptr)&p_Var18[0x21]._M_parent);
                  bVar9 = 1;
                }
LAB_002e524a:
                p_Var17 = (_Rb_tree_node_base *)(ulong)(bVar10 | bVar9);
              }
LAB_002e524d:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_b0.field_2._M_allocated_capacity + 1);
                operator_delete(local_b0._M_dataplus._M_p,(ulong)paVar25);
              }
            }
            else {
              local_200._2_6_ = (undefined6)((ulong)_Var7._M_head_impl >> 0x10);
              local_200[0] = SUB81(_Var7._M_head_impl,0);
              local_200[1] = 0;
              paVar25 = &local_138;
              uVar13 = (**(code **)(*(long *)p_Var16 + 0x10))
                                 (p_Var16,paVar25,p_Var18[4]._M_parent[1]._M_color);
              p_Var17 = (_Rb_tree_node_base *)(ulong)uVar13;
              if ((char)uVar13 == '\0') {
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)pcVar1;
                cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var18[2]._M_parent,pcVar1);
              }
              else {
                if (local_200[1] != '\0') {
                  *(undefined1 *)&p_Var18[0x18]._M_right = local_200[0];
                  goto LAB_002e4d05;
                }
                if (*(char *)&p_Var18[0x25]._M_left == '\x01') {
                  *(undefined1 *)&p_Var18[0x25]._M_left = 0;
                  ConfigurePreset::~ConfigurePreset((ConfigurePreset *)pp_Var3);
                }
              }
            }
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
            ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                       *)&local_138);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        *)local_168,(_Link_type)paVar25);
            if (((ulong)p_Var17 & 1) == 0) {
LAB_002e6733:
              cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var18 + 1),pcVar1);
              goto LAB_002e66b7;
            }
LAB_002e5296:
            p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
          } while (p_Var18 != local_140);
        }
        p_Var21 = (this->BuildPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var21 != local_110) {
          pcVar1 = &this->parseState;
LAB_002e52cd:
          if ((char)p_Var21[4]._M_color == _S_red) {
            iVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                     ::find(&this_00->_M_t,(key_type *)&p_Var21[8]._M_right);
            if (iVar19._M_node == local_140) {
              cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var21 + 1),pcVar1);
              goto LAB_002e66b7;
            }
            cVar20 = std::
                     _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)&p_Var21[4]._M_parent[1]._M_parent,
                            (key_type *)&iVar19._M_node[4]._M_parent);
            if (cVar20.super__Node_iterator_base<cmCMakePresetsGraph::File_*,_false>._M_cur ==
                (__node_type *)0x0) {
              cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                        ((string *)(p_Var21 + 1),pcVar1);
              goto LAB_002e66b7;
            }
            if ((*(undefined1 *)((long)&p_Var21[9]._M_right + 1) != '\x01') ||
               (((ulong)p_Var21[9]._M_right & 1) != 0)) {
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
              ::
              _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          *)&p_Var21[7]._M_parent,iVar19._M_node[8],
                         (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )&iVar19._M_node[7]._M_left);
            }
          }
          pp_Var3 = &p_Var21[0xd]._M_parent;
          std::optional<cmCMakePresetsGraph::BuildPreset>::
          emplace<cmCMakePresetsGraph::BuildPreset_const&>
                    ((optional<cmCMakePresetsGraph::BuildPreset> *)pp_Var3,
                     (BuildPreset *)(p_Var21 + 2));
          local_200._8_8_ = local_200._8_8_ & 0xffffffff00000000;
          local_1f0._M_allocated_capacity = 0;
          local_1f0._8_8_ = local_200 + 8;
          local_1d8 = 0;
          local_1e0 = (Error *)local_1f0._8_8_;
          for (p_Var18 = p_Var21[0x13]._M_parent;
              p_Var18 != (_Rb_tree_node_base *)&p_Var21[0x12]._M_right;
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
            pmVar15 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                    *)local_200,(key_type *)(p_Var18 + 1));
            *pmVar15 = Unvisited;
          }
          local_1b8._0_8_ = (pointer)0x0;
          local_1b8._8_8_ = (pointer)0x0;
          local_1b8._16_8_ = (Error *)0x0;
          local_178._0_8_ = operator_new(0x38);
          ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander =
               (_func_int **)&PTR_operator___00bbad40;
          ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
          *(undefined1 *)&((MacroExpander *)(local_178._0_8_ + 0x30))->_vptr_MacroExpander = 0;
          p_Var26 = (_Link_type)local_178;
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
          ::
          emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                    ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                      *)local_1b8,
                     (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                      *)p_Var26);
          if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
            (*(*(_func_int ***)local_178._0_8_)[2])();
          }
          local_178._0_8_ = operator_new(0x18);
          ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander =
               (_func_int **)&PTR_operator___00bbb238;
          ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
          ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander =
               (_func_int **)(p_Var21 + 2);
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
          ::
          emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                    ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                      *)local_1b8,
                     (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                      *)p_Var26);
          if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
            (*(*(_func_int ***)local_178._0_8_)[2])();
          }
          local_178._0_8_ = operator_new(0x20);
          *(undefined ***)local_178._0_8_ = &PTR_operator___00bbb0b8;
          ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_200;
          ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3;
          ((MacroExpander *)(local_178._0_8_ + 0x18))->_vptr_MacroExpander = (_func_int **)local_1b8
          ;
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
          ::
          emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                    ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                      *)local_1b8,
                     (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                      *)p_Var26);
          if ((_Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
               )local_178._0_8_ != (MacroExpander *)0x0) {
            (*(*(_func_int ***)local_178._0_8_)[2])();
          }
          p_Var18 = p_Var21[0x13]._M_parent;
          _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
          while (local_178._0_8_ = _Var7._M_head_impl,
                p_Var18 != (_Rb_tree_node_base *)&p_Var21[0x12]._M_right) {
            if ((char)p_Var18[3]._M_color == _S_black) {
              p_Var26 = (_Link_type)(p_Var18 + 1);
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_200,(key_type *)p_Var26);
              if (*pmVar15 != Verified) {
                if (*pmVar15 == InProgress) {
LAB_002e6749:
                  p_Var26 = (_Link_type)pcVar1;
                  cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var21[2]._M_parent,pcVar1)
                  ;
                  goto LAB_002e6757;
                }
                _Var5 = p_Var21[4]._M_parent[1]._M_color;
                *pmVar15 = InProgress;
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)(p_Var18 + 2),(MacroExpanderVector *)p_Var26,_Var5);
                if (EVar12 == Ok) {
                  *pmVar15 = Verified;
                }
                else {
                  if (EVar12 == Ignore) goto LAB_002e5617;
                  if (EVar12 == Error) goto LAB_002e6749;
                }
              }
            }
            p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
            _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
          }
          p_Var16 = p_Var21[6]._M_left;
          if (p_Var16 == (_Base_ptr)0x0) {
LAB_002e5580:
            p_Var6 = p_Var21[0x15]._M_right;
            for (p_Var16 = p_Var21[0x15]._M_left; p_Var16 != p_Var6; p_Var16 = p_Var16 + 1) {
              p_Var26 = (_Link_type)local_1b8;
              EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                 ((string *)p_Var16,(MacroExpanderVector *)p_Var26,
                                  p_Var21[4]._M_parent[1]._M_color);
              if (EVar12 == Error) goto LAB_002e6757;
              if (EVar12 == Ignore) goto LAB_002e5617;
            }
            p_Var16 = p_Var21[0x17]._M_left;
            p_Var6 = p_Var21[0x17]._M_right;
            bVar10 = 1;
            if (p_Var16 != p_Var6) {
              do {
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)p_Var16,(MacroExpanderVector *)p_Var26,
                                    p_Var21[4]._M_parent[1]._M_color);
                if (EVar12 == Error) {
                  bVar10 = 0;
                  break;
                }
                if (EVar12 == Ignore) {
                  p_Var16 = (_Base_ptr)0x1;
                  if (*(char *)&p_Var21[0x18]._M_left == '\x01') {
                    *(undefined1 *)&p_Var21[0x18]._M_left = 0;
                    BuildPreset::~BuildPreset((BuildPreset *)pp_Var3);
                  }
                  bVar10 = 0;
                  goto LAB_002e5695;
                }
                p_Var16 = p_Var16 + 1;
                bVar10 = 1;
              } while (p_Var16 != p_Var6);
              p_Var16 = (_Base_ptr)0x0;
            }
LAB_002e5695:
            bVar10 = bVar10 | (byte)p_Var16;
          }
          else {
            local_178._2_6_ = (undefined6)((ulong)_Var7._M_head_impl >> 0x10);
            local_178[0] = SUB81(_Var7._M_head_impl,0);
            local_178[1] = 0;
            p_Var26 = (_Link_type)local_1b8;
            bVar10 = (**(code **)(*(long *)p_Var16 + 0x10))
                               (p_Var16,p_Var26,p_Var21[4]._M_parent[1]._M_color);
            if (bVar10 == 0) {
              p_Var26 = (_Link_type)pcVar1;
              cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var21[2]._M_parent,pcVar1);
            }
            else {
              if (local_178[1] != _S_red >> 8) {
                *(undefined1 *)&p_Var21[0x12]._M_parent = local_178[0];
                goto LAB_002e5580;
              }
              if (*(char *)&p_Var21[0x18]._M_left == '\x01') {
                *(undefined1 *)&p_Var21[0x18]._M_left = 0;
                BuildPreset::~BuildPreset((BuildPreset *)pp_Var3);
              }
            }
          }
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                     *)local_1b8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      *)local_1f0._M_allocated_capacity,p_Var26);
          if ((bVar10 & 1) != 0) goto LAB_002e56bb;
          goto LAB_002e676b;
        }
LAB_002e56d4:
        p_Var21 = (this->TestPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var21 != local_118) {
          pcVar1 = &this->parseState;
          do {
            if ((char)p_Var21[4]._M_color == _S_red) {
              iVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find(&this_00->_M_t,(key_type *)&p_Var21[8]._M_right);
              if (iVar19._M_node == local_140) {
                cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var21 + 1),pcVar1);
                goto LAB_002e66b7;
              }
              cVar20 = std::
                       _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)&p_Var21[4]._M_parent[1]._M_parent,
                              (key_type *)&iVar19._M_node[4]._M_parent);
              if (cVar20.super__Node_iterator_base<cmCMakePresetsGraph::File_*,_false>._M_cur ==
                  (__node_type *)0x0) {
                cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                          ((string *)(p_Var21 + 1),pcVar1);
                goto LAB_002e66b7;
              }
              if ((*(undefined1 *)((long)&p_Var21[9]._M_right + 1) != '\x01') ||
                 (((ulong)p_Var21[9]._M_right & 1) != 0)) {
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                ::
                _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                            *)&p_Var21[7]._M_parent,iVar19._M_node[8],
                           (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )&iVar19._M_node[7]._M_left);
              }
            }
            pp_Var3 = &p_Var21[0x1e]._M_parent;
            std::optional<cmCMakePresetsGraph::TestPreset>::
            emplace<cmCMakePresetsGraph::TestPreset_const&>
                      ((optional<cmCMakePresetsGraph::TestPreset> *)pp_Var3,
                       (TestPreset *)(p_Var21 + 2));
            local_200._8_8_ = local_200._8_8_ & 0xffffffff00000000;
            local_1f0._M_allocated_capacity = 0;
            local_1f0._8_8_ = local_200 + 8;
            local_1d8 = 0;
            local_1e0 = (Error *)local_1f0._8_8_;
            for (p_Var18 = p_Var21[0x24]._M_parent;
                p_Var18 != (_Rb_tree_node_base *)&p_Var21[0x23]._M_right;
                p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_200,(key_type *)(p_Var18 + 1));
              *pmVar15 = Unvisited;
            }
            local_1b8._0_8_ = (pointer)0x0;
            local_1b8._8_8_ = (pointer)0x0;
            local_1b8._16_8_ = (Error *)0x0;
            local_178._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00bbad40;
            ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_178._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            p_Var26 = (_Link_type)local_178;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_1b8,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)p_Var26);
            if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_178._0_8_)[2])();
            }
            local_178._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00bbb278;
            ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var21 + 2);
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_1b8,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)p_Var26);
            if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_178._0_8_)[2])();
            }
            local_178._0_8_ = operator_new(0x20);
            *(undefined ***)local_178._0_8_ = &PTR_operator___00bbb0f8;
            ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_200;
            ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3
            ;
            ((MacroExpander *)(local_178._0_8_ + 0x18))->_vptr_MacroExpander =
                 (_func_int **)local_1b8;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_1b8,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)p_Var26);
            if ((_Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                 )local_178._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_178._0_8_)[2])();
            }
            p_Var18 = p_Var21[0x24]._M_parent;
            _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
            while (local_178._0_8_ = _Var7._M_head_impl,
                  p_Var18 != (_Rb_tree_node_base *)&p_Var21[0x23]._M_right) {
              if ((char)p_Var18[3]._M_color == _S_black) {
                p_Var26 = (_Link_type)(p_Var18 + 1);
                pmVar15 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                        *)local_200,(key_type *)p_Var26);
                if (*pmVar15 != Verified) {
                  if (*pmVar15 == InProgress) {
LAB_002e6781:
                    p_Var26 = (_Link_type)pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED
                              ((string *)&p_Var21[2]._M_parent,pcVar1);
                    goto LAB_002e678f;
                  }
                  _Var5 = p_Var21[4]._M_parent[1]._M_color;
                  *pmVar15 = InProgress;
                  p_Var26 = (_Link_type)local_1b8;
                  EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)(p_Var18 + 2),(MacroExpanderVector *)p_Var26,_Var5);
                  if (EVar12 == Ok) {
                    *pmVar15 = Verified;
                  }
                  else {
                    if (EVar12 == Ignore) goto LAB_002e5c29;
                    if (EVar12 == Error) goto LAB_002e6781;
                  }
                }
              }
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
              _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
            }
            p_Var16 = p_Var21[6]._M_left;
            if (p_Var16 == (_Base_ptr)0x0) {
LAB_002e59a5:
              p_Var6 = p_Var21[0x27]._M_left;
              for (p_Var16 = p_Var21[0x27]._M_parent; p_Var16 != p_Var6; p_Var16 = p_Var16 + 1) {
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)p_Var16,(MacroExpanderVector *)p_Var26,
                                    p_Var21[4]._M_parent[1]._M_color);
                if (EVar12 == Error) goto LAB_002e678f;
                if (EVar12 == Ignore) goto LAB_002e5c29;
              }
              if ((char)p_Var21[0x2c]._M_color == _S_black) {
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var21[0x28]._M_right,(MacroExpanderVector *)p_Var26
                                    ,p_Var21[4]._M_parent[1]._M_color);
                if (EVar12 == Ignore) {
LAB_002e5c29:
                  if (*(char *)&p_Var21[0x3a]._M_left != '\0') {
                    *(undefined1 *)&p_Var21[0x3a]._M_left = 0;
                    TestPreset::~TestPreset((TestPreset *)pp_Var3);
                  }
LAB_002e5c46:
                  std::
                  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                  ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                             *)local_1b8);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                              *)local_1f0._M_allocated_capacity,p_Var26);
                  goto LAB_002e5c98;
                }
                if (EVar12 != Error) {
                  p_Var26 = (_Link_type)local_1b8;
                  EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var21[0x29]._M_right,
                                      (MacroExpanderVector *)p_Var26,
                                      p_Var21[4]._M_parent[1]._M_color);
                  if (EVar12 == Ignore) goto LAB_002e5c29;
                  if (EVar12 != Error) goto LAB_002e5a5d;
                }
              }
              else {
LAB_002e5a5d:
                if ((char)p_Var21[0x37]._M_color != _S_black) goto LAB_002e5bf6;
                if (*(char *)&p_Var21[0x31]._M_parent != '\x01') goto LAB_002e5b07;
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var21[0x2c]._M_parent,
                                    (MacroExpanderVector *)p_Var26,p_Var21[4]._M_parent[1]._M_color)
                ;
                if (EVar12 == Ignore) goto LAB_002e5c29;
                if (EVar12 == Error) goto LAB_002e678f;
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var21[0x2d]._M_parent,
                                    (MacroExpanderVector *)p_Var26,p_Var21[4]._M_parent[1]._M_color)
                ;
                if (EVar12 == Ignore) goto LAB_002e5c29;
                if (EVar12 != Error) {
                  if (*(char *)&p_Var21[0x30]._M_right == '\x01') {
                    p_Var26 = (_Link_type)local_1b8;
                    EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                       ((string *)&p_Var21[0x2f]._M_right,
                                        (MacroExpanderVector *)p_Var26,
                                        p_Var21[4]._M_parent[1]._M_color);
                    if (EVar12 == Ignore) goto LAB_002e5c29;
                    if (EVar12 == Error) goto LAB_002e678f;
                  }
LAB_002e5b07:
                  if (*(char *)&p_Var21[0x36]._M_right != '\x01') {
LAB_002e5bf6:
                    if (*(char *)&p_Var21[0x3a]._M_parent == '\x01') {
                      p_Var26 = (_Link_type)local_1b8;
                      EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)&p_Var21[0x37]._M_right,
                                          (MacroExpanderVector *)p_Var26,
                                          p_Var21[4]._M_parent[1]._M_color);
                      if (EVar12 == Ignore) goto LAB_002e5c29;
                      if (EVar12 == Error) goto LAB_002e678f;
                    }
                    goto LAB_002e5c46;
                  }
                  p_Var26 = (_Link_type)local_1b8;
                  EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)&p_Var21[0x31]._M_left,
                                      (MacroExpanderVector *)p_Var26,
                                      p_Var21[4]._M_parent[1]._M_color);
                  if (EVar12 == Ignore) goto LAB_002e5c29;
                  if (EVar12 != Error) {
                    p_Var26 = (_Link_type)local_1b8;
                    EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                       ((string *)&p_Var21[0x32]._M_left,
                                        (MacroExpanderVector *)p_Var26,
                                        p_Var21[4]._M_parent[1]._M_color);
                    if (EVar12 == Ignore) goto LAB_002e5c29;
                    if (EVar12 != Error) {
                      if (*(char *)&p_Var21[0x36]._M_left != '\x01') goto LAB_002e5bf6;
                      p_Var26 = (_Link_type)local_1b8;
                      EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                         ((string *)&p_Var21[0x33]._M_left,
                                          (MacroExpanderVector *)p_Var26,
                                          p_Var21[4]._M_parent[1]._M_color);
                      if (EVar12 == Ignore) goto LAB_002e5c29;
                      if (EVar12 != Error) {
                        p_Var26 = (_Link_type)local_1b8;
                        EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                           ((string *)&p_Var21[0x34]._M_left,
                                            (MacroExpanderVector *)p_Var26,
                                            p_Var21[4]._M_parent[1]._M_color);
                        if (EVar12 == Ignore) goto LAB_002e5c29;
                        if (EVar12 != Error) {
                          p_Var26 = (_Link_type)local_1b8;
                          EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                             ((string *)&p_Var21[0x35]._M_left,
                                              (MacroExpanderVector *)p_Var26,
                                              p_Var21[4]._M_parent[1]._M_color);
                          if (EVar12 == Ignore) goto LAB_002e5c29;
                          if (EVar12 != Error) goto LAB_002e5bf6;
                        }
                      }
                    }
                  }
                }
              }
LAB_002e678f:
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_1b8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1f0._M_allocated_capacity,p_Var26);
LAB_002e67a3:
              cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var21 + 1),pcVar1);
              goto LAB_002e66b7;
            }
            local_178._2_6_ = (undefined6)((ulong)_Var7._M_head_impl >> 0x10);
            local_178[0] = SUB81(_Var7._M_head_impl,0);
            local_178[1] = 0;
            p_Var26 = (_Link_type)local_1b8;
            cVar11 = (**(code **)(*(long *)p_Var16 + 0x10))
                               (p_Var16,p_Var26,p_Var21[4]._M_parent[1]._M_color);
            if (cVar11 == '\0') {
              p_Var26 = (_Link_type)pcVar1;
              cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var21[2]._M_parent,pcVar1);
            }
            else {
              if (local_178[1] != _S_red >> 8) {
                *(undefined1 *)&p_Var21[0x23]._M_parent = local_178[0];
                goto LAB_002e59a5;
              }
              if (*(char *)&p_Var21[0x3a]._M_left == '\x01') {
                *(undefined1 *)&p_Var21[0x3a]._M_left = 0;
                TestPreset::~TestPreset((TestPreset *)pp_Var3);
              }
            }
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
            ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                       *)local_1b8);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        *)local_1f0._M_allocated_capacity,p_Var26);
            if (cVar11 == '\0') goto LAB_002e67a3;
LAB_002e5c98:
            p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
          } while (p_Var21 != local_118);
        }
        p_Var18 = (this->PackagePresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var2 = &(this->PackagePresets)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var18 != p_Var2) {
          pcVar1 = &this->parseState;
          do {
            if ((char)p_Var18[4]._M_color == _S_red) {
              iVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find(&this_00->_M_t,(key_type *)&p_Var18[8]._M_right);
              if (iVar19._M_node == local_140) {
                cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET((string *)(p_Var18 + 1),pcVar1);
                goto LAB_002e66b7;
              }
              cVar20 = std::
                       _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)&p_Var18[4]._M_parent[1]._M_parent,
                              (key_type *)&iVar19._M_node[4]._M_parent);
              if (cVar20.super__Node_iterator_base<cmCMakePresetsGraph::File_*,_false>._M_cur ==
                  (__node_type *)0x0) {
                cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE
                          ((string *)(p_Var18 + 1),pcVar1);
                goto LAB_002e66b7;
              }
              if ((*(char *)((long)&p_Var18[9]._M_right + 1) != '\x01') ||
                 (((ulong)p_Var18[9]._M_right & 1) != 0)) {
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                ::
                _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                            *)&p_Var18[7]._M_parent,iVar19._M_node[8],
                           (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )&iVar19._M_node[7]._M_left);
              }
            }
            pp_Var3 = &p_Var18[0x12]._M_parent;
            std::optional<cmCMakePresetsGraph::PackagePreset>::
            emplace<cmCMakePresetsGraph::PackagePreset_const&>
                      ((optional<cmCMakePresetsGraph::PackagePreset> *)pp_Var3,
                       (PackagePreset *)(p_Var18 + 2));
            local_200._8_8_ = local_200._8_8_ & 0xffffffff00000000;
            local_1f0._M_allocated_capacity = 0;
            local_1f0._8_8_ = local_200 + 8;
            local_1d8 = 0;
            local_1e0 = (Error *)local_1f0._8_8_;
            for (p_Var17 = p_Var18[0x18]._M_parent;
                p_Var17 != (_Rb_tree_node_base *)&p_Var18[0x17]._M_right;
                p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                      *)local_200,(key_type *)(p_Var17 + 1));
              *pmVar15 = Unvisited;
            }
            local_1b8._0_8_ = (pointer)0x0;
            local_1b8._8_8_ = (pointer)0x0;
            local_1b8._16_8_ = (Error *)0x0;
            local_178._0_8_ = operator_new(0x38);
            ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00bbad40;
            ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            *(undefined1 *)&((MacroExpander *)(local_178._0_8_ + 0x30))->_vptr_MacroExpander = 0;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_1b8,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_178);
            if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_178._0_8_)[2])();
            }
            local_178._0_8_ = operator_new(0x18);
            ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander =
                 (_func_int **)&PTR_operator___00bbb2b8;
            ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
            ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander =
                 (_func_int **)(p_Var18 + 2);
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_1b8,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_178);
            if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_178._0_8_)[2])();
            }
            local_178._0_8_ = operator_new(0x20);
            *(undefined ***)local_178._0_8_ = &PTR_operator___00bbb138;
            ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_200;
            ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3
            ;
            ((MacroExpander *)(local_178._0_8_ + 0x18))->_vptr_MacroExpander =
                 (_func_int **)local_1b8;
            std::
            vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
            ::
            emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
                      ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
                        *)local_1b8,
                       (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                        *)local_178);
            if ((_Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
                 )local_178._0_8_ != (MacroExpander *)0x0) {
              (*(*(_func_int ***)local_178._0_8_)[2])();
            }
            p_Var17 = p_Var18[0x18]._M_parent;
            _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
            while (local_178._0_8_ = _Var7._M_head_impl,
                  p_Var17 != (_Rb_tree_node_base *)&p_Var18[0x17]._M_right) {
              if ((char)p_Var17[3]._M_color == _S_black) {
                pmVar15 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                                        *)local_200,(key_type *)(p_Var17 + 1));
                if (*pmVar15 != Verified) {
                  if (*pmVar15 == InProgress) {
LAB_002e67b9:
                    p_Var26 = (_Link_type)pcVar1;
                    cmCMakePresetsErrors::INVALID_PRESET_NAMED
                              ((string *)&p_Var18[2]._M_parent,pcVar1);
                    goto LAB_002e67c7;
                  }
                  _Var5 = p_Var18[4]._M_parent[1]._M_color;
                  *pmVar15 = InProgress;
                  p_Var26 = (_Link_type)local_1b8;
                  EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                     ((string *)(p_Var17 + 2),(MacroExpanderVector *)p_Var26,_Var5);
                  if (EVar12 == Ok) {
                    *pmVar15 = Verified;
                  }
                  else {
                    if (EVar12 == Ignore) goto LAB_002e60b0;
                    if (EVar12 == Error) goto LAB_002e67b9;
                  }
                }
              }
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
            }
            p_Var16 = p_Var18[6]._M_left;
            if (p_Var16 == (_Base_ptr)0x0) {
LAB_002e5f8d:
              for (p_Var17 = p_Var18[0x1c]._M_left; p_Var17 != p_Var18 + 0x1c;
                  p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)(p_Var17 + 2),(MacroExpanderVector *)p_Var26,
                                    p_Var18[4]._M_parent[1]._M_color);
                if (EVar12 == Error) goto LAB_002e67c7;
                if (EVar12 == Ignore) goto LAB_002e60b0;
              }
              p_Var26 = (_Link_type)local_1b8;
              EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                 ((string *)&p_Var18[0x1d]._M_parent,(MacroExpanderVector *)p_Var26,
                                  p_Var18[4]._M_parent[1]._M_color);
              if (EVar12 == Ignore) {
LAB_002e60b0:
                if (*(char *)&p_Var18[0x22]._M_left != '\0') {
                  *(undefined1 *)&p_Var18[0x22]._M_left = 0;
                  PackagePreset::~PackagePreset((PackagePreset *)pp_Var3);
                }
              }
              else {
                if (EVar12 == Error) {
LAB_002e67c7:
                  std::
                  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                  ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                             *)local_1b8);
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                              *)local_1f0._M_allocated_capacity,p_Var26);
                  goto LAB_002e67db;
                }
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var18[0x1e]._M_left,(MacroExpanderVector *)p_Var26,
                                    p_Var18[4]._M_parent[1]._M_color);
                if (EVar12 == Ignore) goto LAB_002e60b0;
                if (EVar12 == Error) goto LAB_002e67c7;
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var18[0x1f]._M_left,(MacroExpanderVector *)p_Var26,
                                    p_Var18[4]._M_parent[1]._M_color);
                if (EVar12 == Ignore) goto LAB_002e60b0;
                if (EVar12 == Error) goto LAB_002e67c7;
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var18[0x20]._M_left,(MacroExpanderVector *)p_Var26,
                                    p_Var18[4]._M_parent[1]._M_color);
                if (EVar12 == Ignore) goto LAB_002e60b0;
                if (EVar12 == Error) goto LAB_002e67c7;
                p_Var26 = (_Link_type)local_1b8;
                EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                                   ((string *)&p_Var18[0x21]._M_left,(MacroExpanderVector *)p_Var26,
                                    p_Var18[4]._M_parent[1]._M_color);
                if (EVar12 == Ignore) goto LAB_002e60b0;
                if (EVar12 == Error) goto LAB_002e67c7;
              }
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_1b8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1f0._M_allocated_capacity,p_Var26);
            }
            else {
              local_178._2_6_ = (undefined6)((ulong)_Var7._M_head_impl >> 0x10);
              local_178[0] = SUB81(_Var7._M_head_impl,0);
              local_178[1] = 0;
              p_Var26 = (_Link_type)local_1b8;
              cVar11 = (**(code **)(*(long *)p_Var16 + 0x10))
                                 (p_Var16,p_Var26,p_Var18[4]._M_parent[1]._M_color);
              if (cVar11 == '\0') {
                p_Var26 = (_Link_type)pcVar1;
                cmCMakePresetsErrors::INVALID_PRESET_NAMED((string *)&p_Var18[2]._M_parent,pcVar1);
              }
              else {
                if (local_178[1] != _S_red >> 8) {
                  *(undefined1 *)&p_Var18[0x17]._M_parent = local_178[0];
                  goto LAB_002e5f8d;
                }
                if (*(char *)&p_Var18[0x22]._M_left == '\x01') {
                  *(undefined1 *)&p_Var18[0x22]._M_left = 0;
                  PackagePreset::~PackagePreset((PackagePreset *)pp_Var3);
                }
              }
              std::
              vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                         *)local_1b8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                          *)local_1f0._M_allocated_capacity,p_Var26);
              if (cVar11 == '\0') {
LAB_002e67db:
                cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var18 + 1),pcVar1);
                goto LAB_002e66b7;
              }
            }
            p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
          } while ((_Rb_tree_header *)p_Var18 != p_Var2);
        }
        local_210 = (this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var4 = &(this->WorkflowPresets)._M_t._M_impl.super__Rb_tree_header;
        bVar8 = true;
        if ((_Rb_tree_header *)local_210 != p_Var4) {
          local_148._M_p = (pointer)&this->parseState;
          local_70 = &p_Var4->_M_header;
LAB_002e6178:
          p_Var16 = local_210[8]._M_right;
          local_68 = *(_Base_ptr *)(local_210 + 9);
          if (p_Var16 != local_68) {
            local_c8 = (WorkflowPreset *)(local_210 + 2);
            p_Var21 = (_Base_ptr)0x0;
LAB_002e61aa:
            _Var5 = p_Var16->_M_color;
            if ((p_Var21 == (_Base_ptr)0x0) && (_Var5 != _S_red)) {
              cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE
                        ((string *)&p_Var16->_M_parent,(cmJSONState *)local_148._M_p);
              goto LAB_002e66b7;
            }
            if ((p_Var21 != (_Base_ptr)0x0) && (_Var5 == _S_red)) {
              cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST
                        ((string *)&p_Var16->_M_parent,(cmJSONState *)local_148._M_p);
              goto LAB_002e66b7;
            }
            switch(_Var5) {
            case _S_red:
              cVar22 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find(&this_00->_M_t,(key_type *)&p_Var16->_M_parent);
              if (cVar22._M_node != local_140) {
                cVar20 = std::
                         _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)&local_210[4]._M_parent[1]._M_parent,
                                (key_type *)&cVar22._M_node[4]._M_parent);
                if (cVar20.super__Node_iterator_base<cmCMakePresetsGraph::File_*,_false>._M_cur !=
                    (__node_type *)0x0) {
                  p_Var21 = cVar22._M_node + 2;
                  goto switchD_002e61e0_default;
                }
LAB_002e6897:
                cmCMakePresetsErrors::WORKFLOW_STEP_UNREACHABLE_FROM_FILE
                          ((string *)&p_Var16->_M_parent,(cmJSONState *)local_148._M_p);
                goto LAB_002e66b7;
              }
              break;
            case _S_black:
              cVar23._M_node =
                   (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                           *)local_b8,(key_type *)&p_Var16->_M_parent);
              if (cVar23._M_node == local_110) break;
              _Var24._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&local_210[4]._M_parent[1]._M_parent,
                          (key_type *)&cVar23._M_node[4]._M_parent);
LAB_002e630d:
              if (_Var24._M_cur == (__node_type *)0x0) goto LAB_002e6897;
              p_Var6 = *(_Base_ptr *)(cVar23._M_node + 9);
              workflowStep = (string *)&p_Var21->_M_parent;
              if ((p_Var21->_M_left == p_Var6) &&
                 ((p_Var6 == (_Base_ptr)0x0 ||
                  (iVar14 = bcmp(cVar23._M_node[8]._M_right,*(_Base_ptr *)workflowStep,
                                 (size_t)p_Var6), iVar14 == 0)))) goto switchD_002e61e0_default;
              goto LAB_002e6882;
            case 2:
              cVar23._M_node =
                   (_Base_ptr)
                   std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                           *)local_c0,(key_type *)&p_Var16->_M_parent);
              if (cVar23._M_node != local_118) {
                _Var24._M_cur =
                     (__node_type *)
                     std::
                     _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)&local_210[4]._M_parent[1]._M_parent,
                            (key_type *)&cVar23._M_node[4]._M_parent);
                goto LAB_002e630d;
              }
              break;
            case 3:
              cVar23 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                       ::find(&local_60->_M_t,(key_type *)&p_Var16->_M_parent);
              if ((_Rb_tree_header *)cVar23._M_node != p_Var2) {
                _Var24._M_cur =
                     (__node_type *)
                     std::
                     _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)&local_210[4]._M_parent[1]._M_parent,
                            (key_type *)&cVar23._M_node[4]._M_parent);
                goto LAB_002e630d;
              }
              break;
            default:
              goto switchD_002e61e0_default;
            }
            workflowStep = (string *)&p_Var16->_M_parent;
LAB_002e6882:
            cmCMakePresetsErrors::INVALID_WORKFLOW_STEPS(workflowStep,(cmJSONState *)local_148._M_p)
            ;
            goto LAB_002e66b7;
          }
          goto LAB_002e68d8;
        }
        goto LAB_002e66c1;
      }
    }
  }
  goto LAB_002e66b7;
LAB_002e6757:
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
             *)local_1b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)local_1f0._M_allocated_capacity,p_Var26);
LAB_002e676b:
  cmCMakePresetsErrors::INVALID_MACRO_EXPANSION((string *)(p_Var21 + 1),pcVar1);
  goto LAB_002e66b7;
LAB_002e5617:
  if (*(char *)&p_Var21[0x18]._M_left != '\0') {
    *(undefined1 *)&p_Var21[0x18]._M_left = 0;
    BuildPreset::~BuildPreset((BuildPreset *)pp_Var3);
  }
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
             *)local_1b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)local_1f0._M_allocated_capacity,p_Var26);
LAB_002e56bb:
  p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
  if (p_Var21 == local_110) goto LAB_002e56d4;
  goto LAB_002e52cd;
switchD_002e61e0_default:
  p_Var16 = (_Base_ptr)&p_Var16[1]._M_parent;
  if (p_Var16 == local_68) goto code_r0x002e6371;
  goto LAB_002e61aa;
code_r0x002e6371:
  if (p_Var21 == (_Base_ptr)0x0) {
LAB_002e68d8:
    cmCMakePresetsErrors::NO_WORKFLOW_STEPS((string *)(local_210 + 1),(cmJSONState *)local_148._M_p)
    ;
    goto LAB_002e66b7;
  }
  pp_Var3 = &local_210[9]._M_left;
  std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
            ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var3);
  WorkflowPreset::WorkflowPreset((WorkflowPreset *)pp_Var3,local_c8);
  *(undefined1 *)&local_210[0x11]._M_color = _S_black;
  local_200._8_8_ = local_200._8_8_ & 0xffffffff00000000;
  local_1f0._M_allocated_capacity = 0;
  local_1f0._8_8_ = local_200 + 8;
  local_1d8 = 0;
  local_1e0 = (Error *)local_1f0._8_8_;
  for (p_Var18 = local_210[0xf]._M_left; p_Var18 != local_210 + 0xf;
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                            *)local_200,(key_type *)(p_Var18 + 1));
    *pmVar15 = Unvisited;
  }
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (pointer)0x0;
  local_1b8._16_8_ = (Error *)0x0;
  local_178._0_8_ = operator_new(0x38);
  ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander = (_func_int **)&PTR_operator___00bbad40;
  ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
  *(undefined1 *)&((MacroExpander *)(local_178._0_8_ + 0x30))->_vptr_MacroExpander = 0;
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
  ::
  emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
            ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
              *)local_1b8,
             (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
              *)local_178);
  if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
    (*(*(_func_int ***)local_178._0_8_)[2])();
  }
  local_178._0_8_ = operator_new(0x18);
  ((MacroExpander *)local_178._0_8_)->_vptr_MacroExpander = (_func_int **)&PTR_operator___00bbb2f8;
  ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)this;
  ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)local_c8;
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
  ::
  emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
            ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
              *)local_1b8,
             (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
              *)local_178);
  if ((MacroExpander *)local_178._0_8_ != (MacroExpander *)0x0) {
    (*(*(_func_int ***)local_178._0_8_)[2])();
  }
  local_178._0_8_ = operator_new(0x20);
  *(undefined ***)local_178._0_8_ = &PTR_operator___00bbb178;
  ((MacroExpander *)(local_178._0_8_ + 8))->_vptr_MacroExpander = (_func_int **)local_200;
  ((MacroExpander *)(local_178._0_8_ + 0x10))->_vptr_MacroExpander = (_func_int **)pp_Var3;
  ((MacroExpander *)(local_178._0_8_ + 0x18))->_vptr_MacroExpander = (_func_int **)local_1b8;
  _Var27._M_p = local_178;
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
  ::
  emplace_back<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>
            ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>
              *)local_1b8,
             (unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
              *)_Var27._M_p);
  if ((_Tuple_impl<0UL,_cmCMakePresetsGraphInternal::MacroExpander_*,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
       )local_178._0_8_ != (MacroExpander *)0x0) {
    (*(*(_func_int ***)local_178._0_8_)[2])();
  }
  p_Var18 = local_210[0xf]._M_left;
  _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
  while (local_178._0_8_ = _Var7._M_head_impl, p_Var18 != local_210 + 0xf) {
    if ((char)p_Var18[3]._M_color == _S_black) {
      _Var27._M_p = (pointer)(p_Var18 + 1);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                              *)local_200,(key_type *)_Var27._M_p);
      if (*pmVar15 != Verified) {
        if (*pmVar15 == InProgress) {
LAB_002e68ee:
          _Var27._M_p = local_148._M_p;
          cmCMakePresetsErrors::INVALID_PRESET_NAMED
                    ((string *)&local_210[2]._M_parent,(cmJSONState *)local_148._M_p);
          std::
          vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
          ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
                     *)local_1b8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                      *)local_1f0._M_allocated_capacity,(_Link_type)_Var27._M_p);
          goto LAB_002e6918;
        }
        _Var5 = local_210[4]._M_parent[1]._M_color;
        *pmVar15 = InProgress;
        _Var27._M_p = local_1b8;
        EVar12 = cmCMakePresetsGraphInternal::ExpandMacros
                           ((string *)(p_Var18 + 2),(MacroExpanderVector *)_Var27._M_p,_Var5);
        if (EVar12 == Ok) {
          *pmVar15 = Verified;
        }
        else {
          if (EVar12 == Ignore) {
            std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                      ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var3);
            goto LAB_002e6641;
          }
          if (EVar12 == Error) goto LAB_002e68ee;
        }
      }
    }
    p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
    _Var7._M_head_impl = (MacroExpander *)local_178._0_8_;
  }
  p_Var16 = local_210[6]._M_left;
  if (p_Var16 == (_Base_ptr)0x0) {
LAB_002e6641:
    std::
    vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
    ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
               *)local_1b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                *)local_1f0._M_allocated_capacity,(_Link_type)_Var27._M_p);
  }
  else {
    local_178._2_6_ = (undefined6)((ulong)_Var7._M_head_impl >> 0x10);
    local_178[0] = SUB81(_Var7._M_head_impl,0);
    local_178[1] = 0;
    _Var27._M_p = local_1b8;
    cVar11 = (**(code **)(*(long *)p_Var16 + 0x10))
                       (p_Var16,_Var27._M_p,local_210[4]._M_parent[1]._M_color,local_178);
    if (cVar11 == '\0') {
      _Var27._M_p = local_148._M_p;
      cmCMakePresetsErrors::INVALID_PRESET_NAMED
                ((string *)&local_210[2]._M_parent,(cmJSONState *)local_148._M_p);
    }
    else {
      if (local_178[1] != _S_red >> 8) {
        *(undefined1 *)&local_210[0xe]._M_left = local_178[0];
        goto LAB_002e6641;
      }
      std::_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>::_M_reset
                ((_Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset> *)pp_Var3);
    }
    std::
    vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
    ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
               *)local_1b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                *)local_1f0._M_allocated_capacity,(_Link_type)_Var27._M_p);
    if (cVar11 == '\0') {
LAB_002e6918:
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION
                ((string *)(local_210 + 1),(cmJSONState *)local_148._M_p);
      goto LAB_002e66b7;
    }
  }
  local_210 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_210);
  if (local_210 == local_70) goto LAB_002e66c1;
  goto LAB_002e6178;
LAB_002e66ad:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)local_1f0._M_allocated_capacity,(_Link_type)__x);
LAB_002e66b7:
  bVar8 = false;
LAB_002e66c1:
  if (local_e8.
      super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool cmCMakePresetsGraph::ReadProjectPresetsInternal(bool allowNoFiles)
{
  bool haveOneFile = false;

  File* file;
  std::string filename = GetUserFilename(this->SourceDir);
  std::vector<File*> inProgressFiles;
  if (cmSystemTools::FileExists(filename)) {
    if (!this->ReadJSONFile(filename, RootType::User, ReadReason::Root,
                            inProgressFiles, file, this->errors)) {
      return false;
    }
    haveOneFile = true;
  } else {
    filename = GetFilename(this->SourceDir);
    if (cmSystemTools::FileExists(filename)) {
      if (!this->ReadJSONFile(filename, RootType::Project, ReadReason::Root,
                              inProgressFiles, file, this->errors)) {
        return false;
      }
      haveOneFile = true;
    }
  }
  assert(inProgressFiles.empty());

  if (!haveOneFile) {
    if (allowNoFiles) {
      return true;
    }
    cmCMakePresetsErrors::FILE_NOT_FOUND(filename, &this->parseState);
    return false;
  }

  bool result = ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->ConfigurePresets, *this) &&
    ComputePresetInheritance(this->BuildPresets, *this) &&
    ComputePresetInheritance(this->TestPresets, *this) &&
    ComputePresetInheritance(this->PackagePresets, *this) &&
    ComputePresetInheritance(this->WorkflowPresets, *this);
  if (!result) {
    return false;
  }

  for (auto& it : this->ConfigurePresets) {
    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->BuildPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->TestPresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->PackagePresets) {
    if (!it.second.Unexpanded.Hidden) {
      const auto configurePreset =
        this->ConfigurePresets.find(it.second.Unexpanded.ConfigurePreset);
      if (configurePreset == this->ConfigurePresets.end()) {
        cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(it.first,
                                                       &this->parseState);
        return false;
      }
      if (!it.second.Unexpanded.OriginFile->ReachableFiles.count(
            configurePreset->second.Unexpanded.OriginFile)) {
        cmCMakePresetsErrors::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE(
          it.first, &this->parseState);
        return false;
      }

      if (it.second.Unexpanded.InheritConfigureEnvironment.value_or(true)) {
        it.second.Unexpanded.Environment.insert(
          configurePreset->second.Unexpanded.Environment.begin(),
          configurePreset->second.Unexpanded.Environment.end());
      }
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  for (auto& it : this->WorkflowPresets) {
    using Type = WorkflowPreset::WorkflowStep::Type;

    const ConfigurePreset* configurePreset = nullptr;
    for (auto const& step : it.second.Unexpanded.Steps) {
      if (configurePreset == nullptr && step.PresetType != Type::Configure) {
        cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE(
          step.PresetName, &this->parseState);
        return false;
      }
      if (configurePreset != nullptr && step.PresetType == Type::Configure) {
        cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST(
          step.PresetName, &this->parseState);
        return false;
      }

      switch (step.PresetType) {
        case Type::Configure:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->ConfigurePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Build:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->BuildPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Test:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->TestPresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
        case Type::Package:
          result = TryReachPresetFromWorkflow(
            it.second.Unexpanded, this->PackagePresets, step.PresetName,
            configurePreset, &this->parseState);
          break;
      }
      if (!result) {
        return false;
      }
    }

    if (configurePreset == nullptr) {
      cmCMakePresetsErrors::NO_WORKFLOW_STEPS(it.first, &this->parseState);
      return false;
    }

    if (!ExpandMacros(*this, it.second.Unexpanded, it.second.Expanded)) {
      cmCMakePresetsErrors::INVALID_MACRO_EXPANSION(it.first,
                                                    &this->parseState);
      return false;
    }
  }

  return true;
}